

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O3

void __thiscall Assimp::D3DS::Node::~Node(Node *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Node *this_00;
  pointer paVar2;
  pointer paVar3;
  pointer paVar4;
  pointer pcVar5;
  bool bVar6;
  pointer ppNVar7;
  ulong uVar8;
  ulong uVar9;
  
  ppNVar7 = (this->mChildren).
            super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->mChildren).
      super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar7) {
    uVar8 = 0;
    uVar9 = 1;
    do {
      this_00 = ppNVar7[uVar8];
      if (this_00 != (Node *)0x0) {
        ~Node(this_00);
      }
      operator_delete(this_00,0xf8);
      ppNVar7 = (this->mChildren).
                super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar6 = uVar9 < (ulong)((long)(this->mChildren).
                                    super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar7 >> 3)
      ;
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar6);
  }
  paVar2 = (this->aCameraRollKeys).
           super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2,(long)(this->aCameraRollKeys).
                                 super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar2);
  }
  paVar3 = (this->aTargetPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3,(long)(this->aTargetPositionKeys).
                                 super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar3);
  }
  paVar3 = (this->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3,(long)(this->aScalingKeys).
                                 super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar3);
  }
  paVar3 = (this->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3,(long)(this->aPositionKeys).
                                 super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar3);
  }
  paVar4 = (this->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar4 != (pointer)0x0) {
    operator_delete(paVar4,(long)(this->aRotationKeys).
                                 super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)paVar4);
  }
  pcVar5 = (this->mDummyName)._M_dataplus._M_p;
  paVar1 = &(this->mDummyName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->mName)._M_dataplus._M_p;
  paVar1 = &(this->mName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  ppNVar7 = (this->mChildren).
            super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar7 != (pointer)0x0) {
    operator_delete(ppNVar7,(long)(this->mChildren).
                                  super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar7
                   );
    return;
  }
  return;
}

Assistant:

~Node()
    {
        for (unsigned int i = 0; i < mChildren.size();++i)
            delete mChildren[i];
    }